

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall Client::OnMessage(Client *this,Handle *handle,BufferPtr *data,uint32_t len)

{
  int iVar1;
  undefined4 extraout_var;
  __shared_ptr<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  __shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  iVar1 = (*((handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_CNSocket[10])();
  std::__shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,&handle->super___shared_ptr<cppnet::CNSocket,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_48,&data->super___shared_ptr<cppnet::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  Session::OnMessage((Session *)CONCAT44(extraout_var,iVar1),(Handle *)&local_38,
                     (BufferPtr *)&_Stack_48,len);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  return;
}

Assistant:

void OnMessage(cppnet::Handle handle, cppnet::BufferPtr data, uint32_t len) {
        auto session = (Session*)handle->GetContext();
        session->OnMessage(handle, data, len);
    }